

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void FreeStyleProps(TidyDocImpl *doc,StyleProp *props)

{
  StyleProp *pSVar1;
  StyleProp *next;
  StyleProp *props_local;
  TidyDocImpl *doc_local;
  
  next = props;
  while (next != (StyleProp *)0x0) {
    pSVar1 = next->next;
    (*doc->allocator->vtbl->free)(doc->allocator,next->name);
    (*doc->allocator->vtbl->free)(doc->allocator,next->value);
    (*doc->allocator->vtbl->free)(doc->allocator,next);
    next = pSVar1;
  }
  return;
}

Assistant:

static void FreeStyleProps(TidyDocImpl* doc, StyleProp *props)
{
    StyleProp *next;

    while (props)
    {
        next = props->next;
        TidyDocFree(doc, props->name);
        TidyDocFree(doc, props->value);
        TidyDocFree(doc, props);
        props = next;
    }
}